

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O0

Expression *
slang::ast::Expression::bindArgument
          (Type *argType,ArgumentDirection direction,bitmask<slang::ast::VariableFlags> argFlags,
          ExpressionSyntax *syntax,ASTContext *context)

{
  Expression *pEVar1;
  undefined2 in_DX;
  int in_ESI;
  ExpressionSyntax *in_RDI;
  SourceRange in_stack_00000000;
  ASTContext *in_stack_00000028;
  ExpressionSyntax *in_stack_00000030;
  Type *in_stack_00000038;
  SourceLocation in_stack_00000040;
  bitmask<slang::ast::VariableFlags> in_stack_0000004e;
  ASTContext *in_stack_000000c0;
  Type *in_stack_000000c8;
  ExpressionSyntax *in_stack_000000d0;
  SourceLocation in_stack_000000d8;
  SourceRange *in_stack_ffffffffffffff40;
  SyntaxNode *in_stack_ffffffffffffff70;
  Token local_80;
  SourceLocation local_70;
  Token local_60;
  SourceLocation local_50;
  bitmask<slang::ast::ASTFlags> local_48 [5];
  undefined4 in_stack_ffffffffffffffe0;
  undefined6 in_stack_fffffffffffffff0;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffff8;
  
  if (in_ESI == 0) {
    SourceRange::SourceRange(in_stack_ffffffffffffff40);
    bitmask<slang::ast::ASTFlags>::bitmask(local_48,None);
    pEVar1 = bindRValue((Type *)CONCAT26(in_DX,in_stack_fffffffffffffff0),in_RDI,in_stack_00000000,
                        (ASTContext *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),
                        in_stack_fffffffffffffff8);
  }
  else if (in_ESI - 1U < 2) {
    local_60 = slang::syntax::SyntaxNode::getFirstToken(in_stack_ffffffffffffff70);
    local_50 = parsing::Token::location(&local_60);
    pEVar1 = bindLValue(in_stack_000000d0,in_stack_000000c8,in_stack_000000d8,in_stack_000000c0,
                        argFlags.m_bits._1_1_);
  }
  else {
    local_80 = slang::syntax::SyntaxNode::getFirstToken(in_stack_ffffffffffffff70);
    local_70 = parsing::Token::location(&local_80);
    pEVar1 = bindRefArg(in_stack_00000038,in_stack_0000004e,in_stack_00000030,in_stack_00000040,
                        in_stack_00000028);
  }
  return pEVar1;
}

Assistant:

const Expression& Expression::bindArgument(const Type& argType, ArgumentDirection direction,
                                           bitmask<VariableFlags> argFlags,
                                           const ExpressionSyntax& syntax,
                                           const ASTContext& context) {
    switch (direction) {
        case ArgumentDirection::In:
            return bindRValue(argType, syntax, {}, context);
        case ArgumentDirection::Out:
        case ArgumentDirection::InOut:
            return bindLValue(syntax, argType, syntax.getFirstToken().location(), context,
                              direction == ArgumentDirection::InOut);
        case ArgumentDirection::Ref:
            return bindRefArg(argType, argFlags, syntax, syntax.getFirstToken().location(),
                              context);
    }
    SLANG_UNREACHABLE;
}